

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error handleUnknownEncoding(XML_Parser parser,XML_Char *encodingName)

{
  XML_UnknownEncodingHandler p_Var1;
  _func_void_ptr_size_t *p_Var2;
  int iVar3;
  void *mem;
  ENCODING *pEVar4;
  long lVar5;
  XML_Error XVar6;
  XML_Encoding local_430;
  
  p_Var1 = parser->m_unknownEncodingHandler;
  XVar6 = XML_ERROR_UNKNOWN_ENCODING;
  if (p_Var1 != (XML_UnknownEncodingHandler)0x0) {
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      local_430.map[lVar5] = -1;
    }
    local_430.data = (void *)0x0;
    local_430.convert = (CONVERTER)0x0;
    local_430.release = (_func_void_void_ptr *)0x0;
    iVar3 = (*p_Var1)(parser->m_unknownEncodingHandlerData,encodingName,&local_430);
    if (iVar3 != 0) {
      p_Var2 = (parser->m_mem).malloc_fcn;
      iVar3 = XmlSizeOfUnknownEncoding();
      mem = (*p_Var2)((long)iVar3);
      parser->m_unknownEncodingMem = mem;
      if (mem == (void *)0x0) {
        XVar6 = XML_ERROR_NO_MEMORY;
      }
      else {
        pEVar4 = XmlInitUnknownEncoding(mem,local_430.map,local_430.convert,local_430.data);
        if (pEVar4 != (ENCODING *)0x0) {
          parser->m_unknownEncodingData = local_430.data;
          parser->m_unknownEncodingRelease = local_430.release;
          parser->m_encoding = pEVar4;
          return XML_ERROR_NONE;
        }
      }
    }
    if (local_430.release != (_func_void_void_ptr *)0x0) {
      (*local_430.release)(local_430.data);
    }
  }
  return XVar6;
}

Assistant:

static enum XML_Error
handleUnknownEncoding(XML_Parser parser, const XML_Char *encodingName) {
  if (parser->m_unknownEncodingHandler) {
    XML_Encoding info;
    int i;
    for (i = 0; i < 256; i++)
      info.map[i] = -1;
    info.convert = NULL;
    info.data = NULL;
    info.release = NULL;
    if (parser->m_unknownEncodingHandler(parser->m_unknownEncodingHandlerData,
                                         encodingName, &info)) {
      ENCODING *enc;
      parser->m_unknownEncodingMem = MALLOC(parser, XmlSizeOfUnknownEncoding());
      if (! parser->m_unknownEncodingMem) {
        if (info.release)
          info.release(info.data);
        return XML_ERROR_NO_MEMORY;
      }
      enc = (parser->m_ns ? XmlInitUnknownEncodingNS : XmlInitUnknownEncoding)(
          parser->m_unknownEncodingMem, info.map, info.convert, info.data);
      if (enc) {
        parser->m_unknownEncodingData = info.data;
        parser->m_unknownEncodingRelease = info.release;
        parser->m_encoding = enc;
        return XML_ERROR_NONE;
      }
    }
    if (info.release != NULL)
      info.release(info.data);
  }
  return XML_ERROR_UNKNOWN_ENCODING;
}